

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_gains.hpp
# Opt level: O2

void __thiscall ear::OutputGainsT<double>::zero(OutputGainsT<double> *this)

{
  pointer pdVar1;
  pointer pdVar2;
  
  pdVar1 = (this->vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar2 = (this->vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    *pdVar2 = 0.0;
  }
  return;
}

Assistant:

virtual void zero() override { std::fill(vec.begin(), vec.end(), (T)0.0); }